

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.cpp
# Opt level: O2

void __thiscall merlin::bte::forward(bte *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer pmVar1;
  findex a;
  long lVar2;
  ostream *poVar3;
  iterator iVar4;
  ulong uVar5;
  size_t i;
  char *pcVar6;
  pointer puVar7;
  size_type *psVar8;
  double dVar9;
  value vVar10;
  double __x;
  double __x_00;
  double dVar11;
  reference rVar12;
  factor F;
  variable VX;
  factor bel;
  factor local_1b0;
  factor local_150;
  factor local_f0;
  factor local_90;
  
  if (this->m_debug == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Begin forward (top-down) pass ...");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  this->m_logz = 0.0;
  dVar9 = timeSystem();
  this_00 = &this->m_var_types;
  for (psVar8 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      psVar8 != (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
    if (this->m_debug == true) {
      poVar3 = std::operator<<((ostream *)&std::cout," - Eliminating var ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,*psVar8);
      pcVar6 = " (MAP)\n";
      if ((*rVar12._M_p & rVar12._M_mask) == 0) {
        pcVar6 = " (SUM)\n";
      }
      std::operator<<(poVar3,pcVar6);
    }
    local_150._vptr_factor = (_func_int **)*psVar8;
    dVar11 = (this->super_graphical_model).m_dims.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(long)local_150._vptr_factor];
    uVar5 = (ulong)dVar11;
    local_150.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5);
    pmVar1 = (this->m_out).
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    a = **(findex **)
          &(this->m_clusters).
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start[*psVar8].super_my_vector<unsigned_long>.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    puVar7 = *(pointer *)
              &pmVar1[a].super_my_vector<unsigned_long>.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    if (*(pointer *)
         ((long)&pmVar1[a].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) != puVar7) {
      i = a * 0x18;
      lVar2 = *(long *)(*(long *)&(this->m_edge_indeces).
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[a].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + *puVar7 * 8);
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,*psVar8);
      if ((*rVar12._M_p & rVar12._M_mask) == 0) {
        incoming(&local_90,this,a,i);
        variable_set::variable_set((variable_set *)&local_f0,(variable *)&local_150);
        factor::sum(&local_1b0,&local_90,(variable_set *)&local_f0);
        factor::operator=((this->m_forward).
                          super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar2,&local_1b0);
      }
      else {
        incoming(&local_90,this,a,i);
        variable_set::variable_set((variable_set *)&local_f0,(variable *)&local_150);
        factor::max(&local_1b0,&local_90,(variable_set *)&local_f0);
        factor::operator=((this->m_forward).
                          super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar2,&local_1b0);
      }
      factor::~factor(&local_1b0);
      variable_set::~variable_set((variable_set *)&local_f0);
      factor::~factor(&local_90);
      if (this->m_debug == true) {
        poVar3 = std::operator<<((ostream *)&std::cout,"  forward msg (");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"): elim = ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," -> ");
        poVar3 = operator<<((ostream *)&std::cout,
                            (this->m_forward).
                            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar2);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
  }
  factor::factor(&local_1b0,0.0);
  puVar7 = (this->m_roots).super_my_vector<unsigned_long>.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (puVar7 == (this->m_roots).super_my_vector<unsigned_long>.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      vVar10 = factor::max(&local_1b0);
      this->m_logz = vVar10 + this->m_logz;
      std::operator<<((ostream *)&std::cout,"[BTE] Finished forward pass in ");
      dVar11 = timeSystem();
      poVar3 = std::ostream::_M_insert<double>(dVar11 - dVar9);
      poVar3 = std::operator<<(poVar3," seconds");
      std::endl<char,std::char_traits<char>>(poVar3);
      factor::~factor(&local_1b0);
      return;
    }
    calc_belief(&local_90,this,*puVar7);
    iVar4 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::find(&(this->m_cluster2var)._M_t,puVar7);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->m_cluster2var)._M_t._M_impl.super__Rb_tree_header) break;
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (this_00,(size_type)iVar4._M_node[1]._M_parent);
    if ((*rVar12._M_p & rVar12._M_mask) == 0) {
      vVar10 = factor::sum(&local_90);
      factor::factor(&local_150,vVar10);
      log((merlin *)&local_f0,__x_00);
      factor::binaryOpIP<merlin::factor::binOpPlus>(&local_1b0,&local_f0);
    }
    else {
      vVar10 = factor::max(&local_90);
      factor::factor(&local_150,vVar10);
      log((merlin *)&local_f0,__x);
      factor::binaryOpIP<merlin::factor::binOpPlus>(&local_1b0,&local_f0);
    }
    factor::~factor(&local_f0);
    factor::~factor(&local_150);
    factor::~factor(&local_90);
    puVar7 = puVar7 + 1;
  }
  __assert_fail("mi != m_cluster2var.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/bte.cpp",
                0x2df,"void merlin::bte::forward()");
}

Assistant:

void bte::forward() {

	if (m_debug) {
		std::cout << "Begin forward (top-down) pass ..." << std::endl;
	}

	m_logz = 0; // reset the log parition function
	double timestamp = timeSystem();
	for (variable_order_t::const_iterator x = m_order.begin(); x != m_order.end(); ++x) {

		if (m_debug) {
			std::cout << " - Eliminating var " << *x
					<< (m_var_types[*x] ? " (MAP)\n" : " (SUM)\n");
		}

		// Generate forward messages
		variable VX = var(*x);
		findex a = m_clusters[*x][0]; // get source bucket of the variable
		if (m_out[a].size() > 0) {
			findex b = *(m_out[a].begin()); // destination bucket
			size_t ei = m_edge_indeces[a][b]; // edge index (for message)
			if (m_var_types[*x] == false) { // SUM variable
				m_forward[ei] = incoming(a, ei).sum(VX);
			} else { // MAP variable
				m_forward[ei] = incoming(a, ei).max(VX);
			}

			if (m_debug) {
				std::cout << "  forward msg (" << a << "," << b << "): elim = " << VX << " -> ";
				std::cout << m_forward[ei] << std::endl;
			}
		}
	} // done

	// Compute log partition function logZ or MAP/MMAP value
	factor F(0.0);
	for (flist::const_iterator ci = m_roots.begin();
			ci != m_roots.end(); ++ci) {

		factor bel = calc_belief(*ci);
		std::map<size_t, size_t>::iterator mi = m_cluster2var.find(*ci);
		assert(mi != m_cluster2var.end());
		size_t v = mi->second;
		if (m_var_types[v] == false) { // SUM variable
			F += log( bel.sum());
		} else { // MAP variable
			F += log( bel.max() );
		}
	}

	// Partition function or MAP/MMAP value
	m_logz += F.max();

	std::cout << "[BTE] Finished forward pass in " << (timeSystem() - timestamp)
			<< " seconds" << std::endl;
}